

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O1

void Abstract<4U>::DistributeCheck
               (HashMap<4U> *mp,count_type HIT,HashMap<4U> *data2block,Abstract<4U> **sketches,
               vector<double,_std::allocator<double>_> *outs)

{
  int iVar1;
  pointer pdVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  mapped_type *pmVar7;
  int iVar8;
  int iVar9;
  _Hash_node_base *p_Var10;
  int iVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar16 [16];
  double dVar17;
  int local_4c;
  
  p_Var10 = (mp->_M_h)._M_before_begin._M_nxt;
  if (p_Var10 == (_Hash_node_base *)0x0) {
    auVar12 = ZEXT816(0) << 0x40;
    dVar17 = 0.0;
    dVar13 = 0.0;
  }
  else {
    dVar17 = 0.0;
    iVar9 = 0;
    local_4c = 0;
    iVar11 = 0;
    do {
      pmVar7 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)data2block,(key_type *)(p_Var10 + 1));
      iVar5 = (*sketches[*pmVar7]->_vptr_Abstract[3])(sketches[*pmVar7],p_Var10 + 1);
      iVar1 = *(int *)((long)&p_Var10[1]._M_nxt + 4);
      if (HIT < iVar1) {
        iVar9 = iVar9 + 1;
        iVar8 = -iVar5;
        if (0 < iVar5) {
          iVar8 = iVar5;
        }
        iVar5 = iVar8;
        if (HIT < iVar8) {
          local_4c = local_4c + 1;
          iVar8 = iVar1 - iVar8;
          iVar6 = -iVar8;
          if (0 < iVar8) {
            iVar6 = iVar8;
          }
          dVar17 = dVar17 + (double)iVar6 / (double)iVar1;
        }
      }
      iVar11 = iVar11 + (uint)(HIT < iVar5);
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
    dVar13 = (double)local_4c;
    auVar12._0_8_ = (double)iVar9;
    auVar12._8_8_ = in_XMM2_Qb;
    auVar16._0_8_ = (double)iVar11;
    auVar16._8_8_ = in_XMM2_Qb;
    auVar12 = vunpcklpd_avx(auVar12,auVar16);
  }
  auVar14._8_8_ = dVar13;
  auVar14._0_8_ = dVar13;
  auVar12 = vdivpd_avx(auVar14,auVar12);
  pdVar2 = (outs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = dVar17 / dVar13;
  *(undefined1 (*) [16])(pdVar2 + 1) = auVar12;
  auVar16 = vshufpd_avx(auVar12,auVar12,1);
  dVar13 = auVar16._0_8_;
  dVar17 = dVar13 + auVar12._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar17;
  uVar3 = vcmpsd_avx512f(auVar15,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  pdVar2[3] = ((dVar13 + dVar13) * auVar12._0_8_) /
              (double)((ulong)bVar4 * 0x3ff0000000000000 + (ulong)!bVar4 * (long)dVar17);
  return;
}

Assistant:

static void DistributeCheck(const HashMap<DATA_LEN>& mp, count_type HIT, HashMap<DATA_LEN>& data2block, Abstract<DATA_LEN>** sketches, std::vector<double>& outs)
	{
		typename HashMap<DATA_LEN>::const_iterator it;
		count_type value = 0, all = 0, hit = 0, size = 0, flagtrue = 0;
		double aae = 0, are = 0, cr = 0, pr = 0, rt = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			int pos = data2block[it->first];
			value = sketches[pos]->QueryTopK(it->first);
			if (it->second > HIT) {
				all++;
				if (value < 0) {
					value = -value;
					flagtrue += 1;
				}
				if (value > HIT) {
					hit += 1;
					aae += abs(it->second - value);
					are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > HIT)
			{
				size += 1;
			}
		}

		aae /= hit;
		are /= hit;
		cr = hit / (double)all;
		pr = hit / (double)size;

		outs[0] = are;
		outs[1] = cr;
		outs[2] = pr;
		outs[3] = 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr);
	}